

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnscapPlugIn.cpp
# Opt level: O2

void libithicap_usage(void)

{
  fwrite("ITHICAP -- a DNSCAP plugin for ITHI data extraction.\n",0x35,1,_stderr);
  fwrite("Usage: ithitools <options>\n",0x1b,1,_stderr);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("  -? -h              Print this page.\n",0x26,1,_stderr);
  fwrite("  -v                 Print the current version number.\n",0x37,1,_stderr);
  fwrite("  -o file.csv        output file containing the computed summary.\n",0x42,1,_stderr);
  fwrite("  -r root-addr.txt   text file containing the list of root server addresses.\n",0x4d,1,
         _stderr);
  fwrite("  -a res-addr.txt\t  allowed list of resolver addresses. Traffic to or from\n",0x4b,1,
         _stderr);
  fwrite("                     addresses in this list will not be filtered out by the\n",0x4c,1,
         _stderr);
  fwrite("                     excessive traffic filtering mechanism.\n",0x3c,1,_stderr);
  fwrite("  -x res-addr.txt\t  excluded list of resolver addresses. Traffic to or from\n",0x4c,1,
         _stderr);
  fwrite("                     these addresses will be ignored when extracting traffic.\n",0x4e,1,
         _stderr);
  fwrite("  -e                 compute ratio of non-cached NX-Domain queries.\n",0x44,1,_stderr);
  fwrite("  -f\t              Filter out address sources that generate too much traffic.\n",0x4e,1,
         _stderr);
  fwrite("  -n number\t      Number of strings in the list of leaking domains(M332).\n",0x4a,1,
         _stderr);
  fwrite("  -T                 Capture a list of TLD found in user queries.\n",0x42,1,_stderr);
  fwrite("  -t tld-file.txt    Text file containing a list of registered TLD, one per line.\n",0x52,
         1,_stderr);
  fwrite("  -u tld-file.txt\t  Text file containing special usage TLD (RFC6761).\n",0x46,1,_stderr);
  return;
}

Assistant:

void libithicap_usage()
    {
        fprintf(stderr, "ITHICAP -- a DNSCAP plugin for ITHI data extraction.\n");
        fprintf(stderr, "Usage: ithitools <options>\n");
        fprintf(stderr, "Options:\n");
        fprintf(stderr, "  -? -h              Print this page.\n");
        fprintf(stderr, "  -v                 Print the current version number.\n");
        fprintf(stderr, "  -o file.csv        output file containing the computed summary.\n");
        fprintf(stderr, "  -r root-addr.txt   text file containing the list of root server addresses.\n");
        fprintf(stderr, "  -a res-addr.txt	  allowed list of resolver addresses. Traffic to or from\n");
        fprintf(stderr, "                     addresses in this list will not be filtered out by the\n");
        fprintf(stderr, "                     excessive traffic filtering mechanism.\n");
        fprintf(stderr, "  -x res-addr.txt	  excluded list of resolver addresses. Traffic to or from\n");
        fprintf(stderr, "                     these addresses will be ignored when extracting traffic.\n");
        fprintf(stderr, "  -e                 compute ratio of non-cached NX-Domain queries.\n");
        fprintf(stderr, "  -f	              Filter out address sources that generate too much traffic.\n");
        fprintf(stderr, "  -n number	      Number of strings in the list of leaking domains(M332).\n");
        fprintf(stderr, "  -T                 Capture a list of TLD found in user queries.\n");
        fprintf(stderr, "  -t tld-file.txt    Text file containing a list of registered TLD, one per line.\n");
        fprintf(stderr, "  -u tld-file.txt	  Text file containing special usage TLD (RFC6761).\n");
#ifdef PRIVACY_CONSCIOUS
        fprintf(stderr, "  -A addr_list.txt   List all IP addresses and their usage in specified file.\n");
        fprintf(stderr, "  -E name_list.txt   List all DNS names found and their usage in specified file.\n");
        fprintf(stderr, "                     Options A and E are rather slow, and have privacy issues.\n");
        fprintf(stderr, "                     No such traces enabled by default.\n");
        fprintf(stderr, "  -g                 Compress addresses and names files using gzip (default: don't).\n");
#endif
    }